

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O1

bool cmsys::SystemTools::SplitProgramPath(string *in_name,string *dir,string *file,bool param_4)

{
  pointer pcVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  string oldDir;
  string local_50;
  
  std::__cxx11::string::_M_assign((string *)dir);
  std::__cxx11::string::_M_replace((ulong)file,0,(char *)file->_M_string_length,0x13a8fa);
  ConvertToUnixSlashes(dir);
  bVar2 = FileIsDirectory(dir);
  if (!bVar2) {
    lVar4 = std::__cxx11::string::rfind((char *)dir,0x13a2be,0xffffffffffffffff);
    if (lVar4 == -1) {
      std::__cxx11::string::_M_assign((string *)file);
      std::__cxx11::string::_M_replace((ulong)dir,0,(char *)dir->_M_string_length,0x13a8fa);
    }
    else {
      std::__cxx11::string::substr((ulong)&local_50,(ulong)dir);
      std::__cxx11::string::operator=((string *)file,(string *)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::substr((ulong)&local_50,(ulong)dir);
      std::__cxx11::string::operator=((string *)dir,(string *)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
  }
  bVar2 = true;
  if (dir->_M_string_length != 0) {
    bVar3 = FileIsDirectory(dir);
    if (!bVar3) {
      pcVar1 = (in_name->_M_dataplus)._M_p;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar1,pcVar1 + in_name->_M_string_length);
      ConvertToUnixSlashes(&local_50);
      std::__cxx11::string::_M_assign((string *)dir);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool SystemTools::SplitProgramPath(const std::string& in_name,
                                   std::string& dir, std::string& file, bool)
{
  dir = in_name;
  file = "";
  SystemTools::ConvertToUnixSlashes(dir);

  if (!SystemTools::FileIsDirectory(dir)) {
    std::string::size_type slashPos = dir.rfind("/");
    if (slashPos != std::string::npos) {
      file = dir.substr(slashPos + 1);
      dir = dir.substr(0, slashPos);
    } else {
      file = dir;
      dir = "";
    }
  }
  if (!(dir.empty()) && !SystemTools::FileIsDirectory(dir)) {
    std::string oldDir = in_name;
    SystemTools::ConvertToUnixSlashes(oldDir);
    dir = in_name;
    return false;
  }
  return true;
}